

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

QString * __thiscall QUrlPrivate::toLocalFile(QUrlPrivate *this,FormattingOptions options)

{
  long lVar1;
  bool bVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  FormattingOptions in_stack_0000000c;
  QString *tmp;
  QString ourPath;
  QStringBuilder<QLatin1String,_const_QString_&> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  CaseSensitivity in_stack_ffffffffffffff34;
  QString *this_00;
  QChar QVar3;
  QString *pQVar4;
  QString *in_stack_ffffffffffffff88;
  QUrlPrivate *in_stack_ffffffffffffff90;
  Section appendingTo;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar3.ucs = L'ꪪ';
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  pQVar4 = in_RDI;
  QString::QString((QString *)0x2fa9fb);
  appendingTo = (Section)((ulong)pQVar4 >> 0x38);
  QString::QString((QString *)0x2faa29);
  appendPath(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_0000000c,appendingTo);
  bVar2 = QString::isEmpty((QString *)0x2faa62);
  if (bVar2) {
    QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (QString *)in_stack_ffffffffffffff28);
  }
  else {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)this_00,CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    ::operator+((QLatin1String *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                (QString *)in_stack_ffffffffffffff28);
    ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff28);
    QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (QString *)in_stack_ffffffffffffff28);
    QString::~QString((QString *)0x2faad8);
    bVar2 = QString::isEmpty((QString *)0x2faae5);
    if (!bVar2) {
      QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffff8e,L'/');
      bVar2 = QString::startsWith(this_00,QVar3,in_stack_ffffffffffffff34);
      QVar3.ucs = (char16_t)((ulong)this_00 >> 0x30);
      in_stack_ffffffffffffff34 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff34);
      if (!bVar2) {
        QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffff8c,L'/');
        QString::operator+=((QString *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                            ,QVar3);
      }
    }
    QString::operator+=((QString *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        (QString *)in_stack_ffffffffffffff28);
  }
  QString::~QString((QString *)0x2fabaa);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QUrlPrivate::toLocalFile(QUrl::FormattingOptions options) const
{
    QString tmp;
    QString ourPath;
    appendPath(ourPath, options, QUrlPrivate::Path);

    // magic for shared drive on windows
    if (!host.isEmpty()) {
        tmp = "//"_L1 + host;
#ifdef Q_OS_WIN // QTBUG-42346, WebDAV is visible as local file on Windows only.
        if (scheme == webDavScheme())
            tmp += webDavSslTag();
#endif
        if (!ourPath.isEmpty() && !ourPath.startsWith(u'/'))
            tmp += u'/';
        tmp += ourPath;
    } else {
        tmp = ourPath;
#ifdef Q_OS_WIN
        // magic for drives on windows
        if (ourPath.length() > 2 && ourPath.at(0) == u'/' && ourPath.at(2) == u':')
            tmp.remove(0, 1);
#endif
    }
    return tmp;
}